

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Request * __thiscall
kj::anon_unknown_36::HttpClientAdapter::request
          (Request *__return_storage_ptr__,HttpClientAdapter *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> expectedBodySize)

{
  long lVar1;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  PromiseFulfiller<kj::HttpClient::Response> *pPVar2;
  ReducePromises<kj::Promise<void>_> RVar3;
  AsyncOutputStream *pAVar4;
  ResponseImpl *pRVar5;
  void *pvVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  void *__child_stack;
  Promise<void> promise;
  PromiseBase local_198;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t> local_180;
  undefined8 in_stack_fffffffffffffe90;
  undefined8 uVar8;
  undefined8 in_stack_fffffffffffffe98;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> in_stack_fffffffffffffea0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> in_stack_fffffffffffffea8;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  in_stack_fffffffffffffeb0;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  OVar9;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_148;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t> responder;
  PromiseFulfillerPair<kj::HttpClient::Response> paf;
  PromiseFulfillerPair<kj::Promise<void>_> requestPaf;
  String urlCopy;
  Maybe<unsigned_long> local_b0;
  OneWayPipe pipe;
  StringPtr url_local;
  
  pvVar6 = (void *)url.content.size_;
  pcVar7 = url.content.ptr;
  url_local.content.ptr = pcVar7;
  url_local.content.size_ = (size_t)pvVar6;
  str<kj::StringPtr&>(&urlCopy,(kj *)&url_local,(StringPtr *)CONCAT44(in_register_00000014,method));
  HttpHeaders::clone((HttpHeaders *)&pipe,(__fn *)headers,__child_stack,(int)pcVar7,pvVar6);
  heap<kj::HttpHeaders>((kj *)&headersCopy,(HttpHeaders *)&pipe);
  HttpHeaders::~HttpHeaders((HttpHeaders *)&pipe);
  local_b0.ptr.isSet = *(bool *)expectedBodySize.ptr._0_8_;
  if (local_b0.ptr.isSet == true) {
    local_b0.ptr.field_1 =
         *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
          (expectedBodySize.ptr._0_8_ + 8);
  }
  newOneWayPipe(&pipe,&local_b0);
  location_00.function = (char *)in_stack_fffffffffffffe98;
  location_00.fileName = (char *)in_stack_fffffffffffffe90;
  location_00._16_8_ = in_stack_fffffffffffffea0.ptr;
  newPromiseAndFulfiller<kj::HttpClient::Response>(location_00);
  pRVar5 = (ResponseImpl *)operator_new(0x30);
  pPVar2 = paf.fulfiller.ptr;
  local_180.disposer = paf.fulfiller.disposer;
  paf.fulfiller.ptr = (PromiseFulfiller<kj::HttpClient::Response> *)0x0;
  (pRVar5->super_Response)._vptr_Response = (_func_int **)&PTR_send_00593560;
  (pRVar5->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00593590
  ;
  *(HttpMethod *)&(pRVar5->super_Refcounted).field_0xc = method;
  (pRVar5->fulfiller).disposer = paf.fulfiller.disposer;
  local_180.ptr = (ResponseImpl *)0x0;
  (pRVar5->fulfiller).ptr = pPVar2;
  (pRVar5->task).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  (pRVar5->super_Refcounted).refcount = 1;
  responder.disposer = &(pRVar5->super_Refcounted).super_Disposer;
  responder.ptr = pRVar5;
  Own<kj::PromiseFulfiller<kj::HttpClient::Response>,_std::nullptr_t>::dispose
            ((Own<kj::PromiseFulfiller<kj::HttpClient::Response>,_std::nullptr_t> *)&local_180);
  location_01.function = (char *)in_stack_fffffffffffffea8.ptr;
  location_01.fileName = (char *)in_stack_fffffffffffffea0.ptr;
  location_01._16_8_ = in_stack_fffffffffffffeb0.ptr;
  newPromiseAndFulfiller<kj::Promise<void>>(location_01);
  RVar3 = requestPaf.promise;
  local_198.node.ptr = (OwnPromiseNode)(OwnPromiseNode)requestPaf.promise.super_PromiseBase.node.ptr
  ;
  requestPaf.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  local_180.disposer = (Disposer *)0x43b3c6;
  local_180.ptr = (ResponseImpl *)0x43ee6b;
  uVar8 = 0xe00001ae2;
  lVar1 = *(long *)((long)RVar3.super_PromiseBase.node.ptr + 8);
  if (lVar1 == 0 || (ulong)((long)RVar3.super_PromiseBase.node.ptr - lVar1) < 0x30) {
    pvVar6 = operator_new(0x400);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)((long)pvVar6 + 0x3d0),&local_198.node,
               kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar6 + 0x3d0) = &PTR_destroy_005939e8;
    *(ResponseImpl **)((long)pvVar6 + 0x3f8) = pRVar5;
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    *(undefined8 *)((long)RVar3.super_PromiseBase.node.ptr + 8) = 0;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)((long)RVar3.super_PromiseBase.node.ptr + -0x30),
               &local_198.node,kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)RVar3.super_PromiseBase.node.ptr + -0x30) = &PTR_destroy_005939e8;
    *(ResponseImpl **)((long)RVar3.super_PromiseBase.node.ptr + -8) = pRVar5;
    *(long *)((long)RVar3.super_PromiseBase.node.ptr + -0x28) = lVar1;
  }
  local_148.ptr = (PromiseNode *)0x0;
  OVar9.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>_>
               *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffeb0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_148);
  location.function = (char *)local_180.ptr;
  location.fileName = (char *)local_180.disposer;
  location.lineNumber = (int)uVar8;
  location.columnNumber = (int)((ulong)uVar8 >> 0x20);
  kj::_::spark<kj::_::Void>((OwnPromiseNode *)&promise,location);
  promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffea8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&pRVar5->task,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffea0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffea0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_198.node);
  if (urlCopy.content.size_ == 0) {
    urlCopy.content.ptr = "";
  }
  (**this->service->_vptr_HttpService)
            (&local_180,this->service,(ulong)method,urlCopy.content.ptr,
             urlCopy.content.size_ + (urlCopy.content.size_ == 0),headersCopy.ptr,pipe.in.ptr,pRVar5
            );
  Promise<void>::
  attach<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
            (&promise,(Own<kj::AsyncInputStream,_std::nullptr_t> *)&local_180,(String *)&pipe,
             (Own<kj::HttpHeaders,_std::nullptr_t> *)&urlCopy);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_180);
  (*((requestPaf.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (requestPaf.fulfiller.ptr,&promise);
  pAVar4 = pipe.out.ptr;
  pipe.out.ptr = (AsyncOutputStream *)0x0;
  (__return_storage_ptr__->body).disposer = pipe.out.disposer;
  (__return_storage_ptr__->body).ptr = pAVar4;
  responder.ptr = (ResponseImpl *)0x0;
  local_180.disposer = &(pRVar5->super_Refcounted).super_Disposer;
  local_180.ptr = pRVar5;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,decltype(nullptr)>>
            ((PromiseDisposer *)&stack0xfffffffffffffeb0,(OwnPromiseNode *)&paf,&local_180);
  (__return_storage_ptr__->response).super_PromiseBase.node.ptr = (PromiseNode *)OVar9.ptr;
  local_148.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_148);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  ::~Own((Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
          *)&stack0xfffffffffffffeb0);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>::~Own(&local_180);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  PromiseFulfillerPair<kj::Promise<void>_>::~PromiseFulfillerPair(&requestPaf);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t>::~Own(&responder);
  PromiseFulfillerPair<kj::HttpClient::Response>::~PromiseFulfillerPair(&paf);
  OneWayPipe::~OneWayPipe(&pipe);
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
  }
  Array<char>::~Array(&urlCopy.content);
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    // We have to clone the URL and headers because HttpService implementation are allowed to
    // assume that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call.
    auto urlCopy = kj::str(url);
    auto headersCopy = kj::heap(headers.clone());

    auto pipe = newOneWayPipe(expectedBodySize);

    // TODO(cleanup): The ownership relationships here are a mess. Can we do something better
    //   involving a PromiseAdapter, maybe?
    auto paf = kj::newPromiseAndFulfiller<Response>();
    auto responder = kj::refcounted<ResponseImpl>(method, kj::mv(paf.fulfiller));

    auto requestPaf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
    responder->setPromise(kj::mv(requestPaf.promise));

    auto promise = service.request(method, urlCopy, *headersCopy, *pipe.in, *responder)
        .attach(kj::mv(pipe.in), kj::mv(urlCopy), kj::mv(headersCopy));
    requestPaf.fulfiller->fulfill(kj::mv(promise));

    return {
      kj::mv(pipe.out),
      paf.promise.attach(kj::mv(responder))
    };
  }